

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Backtrack(TwoStepBranchingProcedure *this,size_t currentNode)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  const_iterator cVar1;
  ostream *poVar2;
  _Storage<unsigned_long,_true> _Var3;
  size_t sVar4;
  size_t extraout_RDX;
  undefined8 uVar5;
  long lVar6;
  unsigned_long *puVar7;
  pointer puVar8;
  unsigned_long *puVar9;
  long lVar10;
  unsigned_long *puVar11;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  _Hash_node_base *p_Var12;
  optional<unsigned_long> oVar13;
  unsigned_long local_40;
  unsigned_long *local_38;
  
  CheckMemoryUsage();
  this_00 = &this->nodesToDeactivate;
  if ((this->nodesToDeactivate)._M_h._M_element_count == 0) goto LAB_00149f8f;
  puVar8 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)local_38 - (long)puVar8;
  if (0 < lVar10 >> 5) {
    lVar6 = (lVar10 >> 5) + 1;
    puVar7 = puVar8 + 2;
    do {
      puVar8 = puVar7;
      local_40 = puVar8[-2];
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        puVar7 = local_38;
        puVar8 = puVar8 + -2;
        goto LAB_00149f37;
      }
      local_40 = puVar8[-1];
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        puVar7 = local_38;
        puVar8 = puVar8 + -1;
        goto LAB_00149f37;
      }
      local_40 = *puVar8;
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      puVar7 = local_38;
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0)
      goto LAB_00149f37;
      local_40 = puVar8[1];
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        puVar7 = local_38;
        puVar8 = puVar8 + 1;
        goto LAB_00149f37;
      }
      lVar6 = lVar6 + -1;
      lVar10 = lVar10 + -0x20;
      puVar7 = puVar8 + 4;
    } while (1 < lVar6);
    puVar8 = puVar8 + 2;
  }
  puVar7 = local_38;
  lVar10 = lVar10 >> 3;
  if (lVar10 == 1) {
LAB_00149f00:
    local_40 = *puVar8;
    cVar1 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,&local_40);
    if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
      puVar8 = puVar7;
    }
LAB_00149f37:
    puVar11 = puVar8 + 1;
    puVar9 = puVar8;
    if (puVar11 != puVar7 && puVar8 != puVar7) {
      do {
        local_40 = *puVar11;
        cVar1 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&this_00->_M_h,&local_40);
        if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
          *puVar8 = *puVar11;
          puVar8 = puVar8 + 1;
        }
        puVar11 = puVar11 + 1;
        puVar9 = puVar8;
      } while (puVar11 != puVar7);
    }
  }
  else {
    if (lVar10 == 2) {
LAB_00149ee3:
      local_40 = *puVar8;
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
        puVar8 = puVar8 + 1;
        goto LAB_00149f00;
      }
      goto LAB_00149f37;
    }
    puVar9 = local_38;
    if (lVar10 == 3) {
      local_40 = *puVar8;
      cVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_40);
      if (cVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
        puVar8 = puVar8 + 1;
        goto LAB_00149ee3;
      }
      goto LAB_00149f37;
    }
  }
  if (puVar9 != (this->activeNodes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
  }
LAB_00149f8f:
  for (p_Var12 = (this->nodesToDeactivate)._M_h._M_before_begin._M_nxt;
      p_Var12 != (_Hash_node_base *)0x0; p_Var12 = p_Var12->_M_nxt) {
    if ((long)*(int *)&p_Var12[1]._M_nxt != this->maxPlacedItemsInfeasibleNodeId) {
      std::__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      reset((__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> *
            )&(this->tree).super_type.m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start[*(int *)&p_Var12[1]._M_nxt].
              super_StoredVertex.m_property.Packing,(pointer)0x0);
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<unsigned_long&>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this_00,&this->maxPlacedItemsInfeasibleNodeId);
  _Var3 = (_Storage<unsigned_long,_true>)
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)_Var3._M_value ==
      (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
  }
  else {
    sVar4 = ((long)(this->tree).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->tree).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    if (this->exploredNodeDisplayInterval < (int)sVar4 - (int)this->exploredNodeDisplayCount) {
      this->exploredNodeDisplayCount = sVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TSBP \t Explored / root outedges / active nodes: ",0x30);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," / ",3);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," / ",3);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      _Var3 = (_Storage<unsigned_long,_true>)
              (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      sVar4 = extraout_RDX;
    }
    _Var3 = (_Storage<unsigned_long,_true>)
            ((_Storage<unsigned_long,_true> *)(_Var3._M_value - 8))->_M_value;
    uVar5 = CONCAT71((int7)(sVar4 >> 8),1);
  }
  oVar13.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar13.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var3._M_value;
  return (optional<unsigned_long>)
         oVar13.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Backtrack(size_t currentNode)
{
    // Check here instead of IsCancelled() to avoid excessive number of memory checks.
    // According to https://stackoverflow.com/a/64166/5587903.
    CheckMemoryUsage();

    // Remove deactivated leaves.
    if (!this->nodesToDeactivate.empty())
    {
        // Delete ordersToRemove from orders according to https://en.wikipedia.org/wiki/Erase%E2%80%93remove_idiom
        this->activeNodes.erase(
            std::remove_if(
                std::begin(this->activeNodes),
                std::end(this->activeNodes),
                [&](size_t nodeToRemove)
                {
                    return this->nodesToDeactivate.contains(nodeToRemove);
                }),
            std::end(this->activeNodes));
    }

    // Clear memory from nodes that will never be used again (fathomed/pruned? What's the terminology here?).
    for (int nodeIdToDeactivate: this->nodesToDeactivate)
    {
        Node& nodeToDeactivate = this->tree[nodeIdToDeactivate];

        if (nodeIdToDeactivate == this->maxPlacedItemsInfeasibleNodeId)
        {
            continue;
        }

        nodeToDeactivate.Packing.reset();
    }

    // TODO.Performance: is this the most efficient way to clear the set?
    ////this->nodesToDeactivate = std::unordered_set<size_t>{ this->maxPlacedItemsInfeasibleNodeId };
    this->nodesToDeactivate.clear();
    this->nodesToDeactivate.emplace(this->maxPlacedItemsInfeasibleNodeId);

    if (this->activeNodes.size() == 0)
    {
        return std::nullopt;
    }

    if ((int)this->tree.m_vertices.size() - (int)this->exploredNodeDisplayCount > (int)this->exploredNodeDisplayInterval)
    {
        this->exploredNodeDisplayCount = this->tree.m_vertices.size();
        size_t outDegree = boost::out_degree(0, this->tree);

        std::cout << "TSBP \t Explored / root outedges / active nodes: " << this->tree.m_vertices.size() << " / " << outDegree << " / " << this->activeNodes.size() << "\n";
    }

    // Backtrack
    return this->activeNodes.back();
}